

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O3

MppTrieInfo * mpp_trie_get_info(MppTrie trie,char *name)

{
  MppTrieNode *pMVar1;
  MppTrieInfo *pMVar2;
  
  if (trie == (MppTrie)0x0 || name == (char *)0x0) {
    pMVar2 = (MppTrieInfo *)0x0;
    _mpp_log_l(2,"mpp_trie","invalid trie %p name %p\n","mpp_trie_get_info",trie);
  }
  else {
    pMVar1 = mpp_trie_get_node(*(MppTrieNode **)((long)trie + 0x30),name);
    if ((pMVar1 == (MppTrieNode *)0x0) || ((long)pMVar1->id < 0)) {
      pMVar2 = (MppTrieInfo *)0x0;
    }
    else {
      pMVar2 = (MppTrieInfo *)((long)pMVar1->id + *(long *)((long)trie + 0x30));
    }
  }
  return pMVar2;
}

Assistant:

MppTrieInfo *mpp_trie_get_info(MppTrie trie, const char *name)
{
    MppTrieImpl *p = (MppTrieImpl *)trie;
    MppTrieNode *node;

    if (!trie || !name) {
        mpp_err_f("invalid trie %p name %p\n", trie, name);
        return NULL;
    }

    node = mpp_trie_get_node(p->nodes, name);
    if (!node || node->id < 0)
        return NULL;

    return (MppTrieInfo *)(((char *)p->nodes) + node->id);
}